

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::
     WriteConstantDelta(char constant,uchar frame_of_reference,idx_t count,uchar *values,
                       bool *validity,void *data_ptr)

{
  uchar in_SIL;
  char in_DIL;
  BitpackingCompressionState<unsigned_char,_true,_signed_char> *in_R8;
  BitpackingCompressionState<unsigned_char,_true,_signed_char> *in_R9;
  BitpackingCompressionState<unsigned_char,_true,_signed_char> *state;
  idx_t in_stack_ffffffffffffffc8;
  BitpackingCompressionState<unsigned_char,_true,_signed_char> *pBVar1;
  
  pBVar1 = in_R9;
  ReserveSpace(in_R9,in_stack_ffffffffffffffc8);
  WriteMetaData(in_R8,(BitpackingMode)((ulong)pBVar1 >> 0x38));
  WriteData<unsigned_char>(&in_R9->data_ptr,in_SIL);
  WriteData<signed_char>(&in_R9->data_ptr,in_DIL);
  UpdateStats(in_R9,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void WriteConstantDelta(T_S constant, T frame_of_reference, idx_t count, T *values, bool *validity,
		                               void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, 2 * sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT_DELTA);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}